

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  uint uVar1;
  ImGuiWindow *window;
  ulong uVar2;
  ImGuiWindow *window_00;
  ImGuiContext *g;
  uint uVar3;
  
  uVar1 = (GImGui->WindowsFocusOrder).Size;
  if (under_this_window != (ImGuiWindow *)0x0) {
    uVar2 = (ulong)uVar1;
    uVar3 = uVar1;
    do {
      uVar2 = uVar2 - 1;
      if ((int)uVar3 < 1) goto LAB_001287de;
      uVar3 = uVar3 - 1;
    } while ((GImGui->WindowsFocusOrder).Data[uVar2 & 0xffffffff] != under_this_window);
    if (uVar3 != 0xffffffff) goto LAB_001287e1;
  }
LAB_001287de:
  uVar3 = uVar1;
LAB_001287e1:
  if ((int)uVar3 < 1) {
    window_00 = (ImGuiWindow *)0x0;
  }
  else {
    uVar2 = (ulong)uVar3 + 1;
    window_00 = (ImGuiWindow *)0x0;
    do {
      if ((int)uVar1 < (int)uVar3) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5c2,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (GImGui->WindowsFocusOrder).Data[uVar2 - 2];
      if ((((window != ignore_window) && (window->WasActive == true)) &&
          (window->RootWindowDockStop == window)) && ((~window->Flags & 0x40200U) != 0)) {
        window_00 = NavRestoreLastChildNavWindow(window);
        break;
      }
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  FocusWindow(window_00);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && window->RootWindowDockStop == window)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                // FIXME-DOCK: This is failing (lagging by one frame) for docked windows.
                // If A and B are docked into window and B disappear, at the NewFrame() call site window->NavLastChildNavWindow will still point to B.
                // We might leverage the tab order implicitly stored in window->DockNodeAsHost->TabBar (essentially the 'most_recently_selected_tab' code in tab bar will do that but on next update)
                // to tell which is the "previous" window. Or we may leverage 'LastFrameFocused/LastFrameJustFocused' and have this function handle child window itself?
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}